

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::PRE::InsertSymDefinitionInLandingPad
          (PRE *this,StackSym *sym,Loop *loop,Sym **objPtrCopyPropSym)

{
  OpCode opcode;
  Opnd *this_00;
  PropertySym *propertySym;
  code *pcVar1;
  Sym *pSVar2;
  bool bVar3;
  OpndKind OVar4;
  OpndKind OVar5;
  BOOLEAN BVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  BasicBlock *pBVar9;
  Value *pVVar10;
  Value *pVVar11;
  Instr *pIVar12;
  StackSym *sym_00;
  undefined1 auStack_58 [8];
  GlobHashBucket bucket;
  
  if (((sym->field_0x18 & 1) == 0) || ((sym->field_5).m_instrDef == (Instr *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x4552,"(sym->IsSingleDef())","sym->IsSingleDef()");
    if (!bVar3) goto LAB_00447946;
    *puVar8 = 0;
  }
  if ((sym->field_0x18 & 1) == 0) {
    pIVar12 = (Instr *)0x0;
  }
  else {
    pIVar12 = (sym->field_5).m_instrDef;
  }
  opcode = pIVar12->m_opcode;
  if (((opcode != Ld_A) && (opcode != BytecodeArgOutCapture)) &&
     (bVar3 = IsPREInstrCandidateLoad(opcode), !bVar3)) {
    return false;
  }
  this_00 = pIVar12->m_src1;
  bucket.value = (Sym *)objPtrCopyPropSym;
  OVar4 = IR::Opnd::GetKind(this_00);
  OVar5 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindSym) {
    if (OVar5 != OpndKindReg) {
      return false;
    }
    OVar4 = IR::Opnd::GetKind(this_00);
    if (OVar4 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar3) goto LAB_00447946;
      *puVar8 = 0;
    }
    sym_00 = IR::Opnd::GetStackSym(this_00);
    bVar3 = GlobOptBlockData::IsLive(&loop->landingPad->globOptData,&sym_00->super_Sym);
    if (bVar3) {
      (bucket.value)->_vptr_Sym = (_func_int **)sym_00;
    }
    else if ((((sym_00->field_0x18 & 1) != 0) && ((sym_00->field_5).m_instrDef != (Instr *)0x0)) &&
            (bVar3 = InsertSymDefinitionInLandingPad(this,sym_00,loop,(Sym **)bucket.value), !bVar3)
            ) {
      return false;
    }
    bVar3 = OpCodeAttr::TempNumberTransfer(pIVar12->m_opcode);
    if ((!bVar3) || (bVar3 = OpCodeAttr::TempObjectTransfer(pIVar12->m_opcode), !bVar3)) {
      (bucket.value)->_vptr_Sym = (_func_int **)sym;
    }
    pIVar12 = IR::Instr::Copy(pIVar12,true);
    if (pIVar12->m_opcode == BytecodeArgOutCapture) {
      pIVar12->m_opcode = Ld_A;
    }
    InsertInstrInLandingPad(this,pIVar12,loop);
    return true;
  }
  if (OVar5 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar3) goto LAB_00447946;
    *puVar8 = 0;
  }
  if (*(char *)((long)this_00[1]._vptr_Opnd + 0x14) != '\x02') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x455c,"(symDefInstrSrc1->AsSymOpnd()->m_sym->IsPropertySym())",
                       "symDefInstrSrc1->AsSymOpnd()->m_sym->IsPropertySym()");
    if (!bVar3) goto LAB_00447946;
    *puVar8 = 0;
  }
  OVar4 = IR::Opnd::GetKind(this_00);
  if (OVar4 != OpndKindSym) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
    if (!bVar3) goto LAB_00447946;
    *puVar8 = 0;
  }
  propertySym = (PropertySym *)this_00[1]._vptr_Opnd;
  if ((propertySym->super_Sym).m_kind != SymKindProperty) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                       ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
    if (!bVar3) goto LAB_00447946;
    *puVar8 = 0;
  }
  BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                    (this->candidates->candidatesBv,(propertySym->super_Sym).m_id);
  if (BVar6 == '\0') {
    return false;
  }
  pBVar9 = Loop::GetAnyTailBlock(loop);
  pVVar10 = GlobOptBlockData::FindValue(&pBVar9->globOptData,(Sym *)propertySym);
  pVVar11 = GlobOptBlockData::FindValue(&loop->landingPad->globOptData,(Sym *)propertySym);
  pSVar2 = bucket.value;
  if (pVVar10->valueNumber != pVVar11->valueNumber) {
    return false;
  }
  (bucket.value)->_vptr_Sym = (_func_int **)pVVar10->valueInfo->symStore;
  BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                    (this->candidates->candidatesToProcess,(propertySym->super_Sym).m_id);
  if (BVar6 == '\0') {
    bVar3 = GlobOptBlockData::IsLive(&loop->landingPad->globOptData,(Sym *)pSVar2->_vptr_Sym);
    if (!bVar3) {
      return false;
    }
    pIVar12 = IR::Instr::Copy(pIVar12,true);
  }
  else {
    auStack_58 = (undefined1  [8])pVVar10;
    bucket.element = (Value *)propertySym;
    BVar7 = PreloadPRECandidate(this,loop,(GlobHashBucket *)auStack_58);
    if (BVar7 == 0) {
      return false;
    }
    BVar6 = BVSparse<Memory::JitArenaAllocator>::Test
                      (this->candidates->candidatesToProcess,(propertySym->super_Sym).m_id);
    if (BVar6 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4581,"(!candidates->candidatesToProcess->Test(propSym->m_id))",
                         "!candidates->candidatesToProcess->Test(propSym->m_id)");
      if (!bVar3) goto LAB_00447946;
      *puVar8 = 0;
    }
    bVar3 = GlobOptBlockData::IsLive(&loop->landingPad->globOptData,pVVar10->valueInfo->symStore);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4582,
                         "(loop->landingPad->globOptData.IsLive(valueOnBackEdge->GetValueInfo()->GetSymStore()))"
                         ,
                         "loop->landingPad->globOptData.IsLive(valueOnBackEdge->GetValueInfo()->GetSymStore())"
                        );
      if (!bVar3) {
LAB_00447946:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar8 = 0;
    }
    pIVar12 = IR::Instr::Copy(pIVar12,true);
  }
  pIVar12 = InsertPropertySymPreloadInLandingPad(this,pIVar12,loop,propertySym);
  return pIVar12 != (Instr *)0x0;
}

Assistant:

bool
GlobOpt::PRE::InsertSymDefinitionInLandingPad(StackSym * sym, Loop * loop, Sym ** objPtrCopyPropSym)
{
    Assert(sym->IsSingleDef());
    IR::Instr * symDefInstr = sym->GetInstrDef();
    if (!GlobOpt::IsPREInstrSequenceCandidateLoad(symDefInstr->m_opcode))
    {
        return false;
    }

    IR::Opnd * symDefInstrSrc1 = symDefInstr->GetSrc1();
    if (symDefInstrSrc1->IsSymOpnd())
    {
        Assert(symDefInstrSrc1->AsSymOpnd()->m_sym->IsPropertySym());
        // $L1
        //      T1 = o.x  (v1|T3)
        //      T2 = T1.y (v2|T4) <-- T1 is not live in the loop landing pad
        //      jmp $L1

        // Trying to make T1 live in the landing pad

        // o.x
        PropertySym* propSym = symDefInstrSrc1->AsSymOpnd()->m_sym->AsPropertySym();

        if (candidates->candidatesBv->Test(propSym->m_id))
        {
            // If propsym is a PRE candidate, then it must have had the same value on all back edges.
            // So, just look up the value on one of the back edges.

            BasicBlock* loopTail = loop->GetAnyTailBlock();
            Value * valueOnBackEdge = loopTail->globOptData.FindValue(propSym);
            
            // If o.x is not invariant in the loop, we can't use the preloaded value of o.x.y in the landing pad
            Value * valueInLandingPad = loop->landingPad->globOptData.FindValue(propSym);
            if (valueOnBackEdge->GetValueNumber() != valueInLandingPad->GetValueNumber())
            {
                return false;
            }

            *objPtrCopyPropSym = valueOnBackEdge->GetValueInfo()->GetSymStore();

            if (candidates->candidatesToProcess->Test(propSym->m_id))
            {
                GlobHashBucket bucket;
                bucket.element = valueOnBackEdge;
                bucket.value = propSym;
                if (!PreloadPRECandidate(loop, &bucket))
                {
                    return false;
                }
                Assert(!candidates->candidatesToProcess->Test(propSym->m_id));
                Assert(loop->landingPad->globOptData.IsLive(valueOnBackEdge->GetValueInfo()->GetSymStore()));

                // Inserted T3 = o.x
                // Now, we want to 
                // 1. Insert T1 = o.x
                // 2. Insert T4 = T1.y
                // 3. Indentify T3 as the objptr copy prop sym for T1, and make T3.y live on the back-edges

                // #1 is done next. #2 and #3 are done as part of preloading T1.y

                // Insert T1 = o.x
                if (!InsertPropertySymPreloadInLandingPad(symDefInstr->Copy(), loop, propSym))
                {
                    return false;
                }
                return true;
            }
            else
            {
                // o.x was already processed as a PRE candidate. If we were successful in preloading o.x,
                // we can now insert T1 = o.x
                if (loop->landingPad->globOptData.IsLive(*objPtrCopyPropSym))
                {
                    // insert T1 = o.x
                    if (!InsertPropertySymPreloadInLandingPad(symDefInstr->Copy(), loop, propSym))
                    {
                        return false;
                    }
                    return true;
                }
                else
                {
                    return false;
                }
            }
        }
        else
        {
            return false;
        }
    }
    else if (symDefInstrSrc1->IsRegOpnd())
    {
        // T2 = T1
        // T3 = T2.y
        // trying to insert def of T2

        // T1
        StackSym * symDefInstrSrc1Sym = symDefInstrSrc1->AsRegOpnd()->GetStackSym();
        if (!loop->landingPad->globOptData.IsLive(symDefInstrSrc1Sym))
        {
            if (symDefInstrSrc1Sym->IsSingleDef())
            {
                if (!InsertSymDefinitionInLandingPad(symDefInstrSrc1Sym, loop, objPtrCopyPropSym))
                {
                    return false;
                }
            }
        }
        else
        {
            *objPtrCopyPropSym = symDefInstrSrc1Sym;
        }

        if (!(OpCodeAttr::TempNumberTransfer(symDefInstr->m_opcode) && OpCodeAttr::TempObjectTransfer(symDefInstr->m_opcode)))
        {
            *objPtrCopyPropSym = sym;
        }
        IR::Instr * instr = symDefInstr->Copy();
        if (instr->m_opcode == Js::OpCode::BytecodeArgOutCapture)
        {
            instr->m_opcode = Js::OpCode::Ld_A;
        }
        InsertInstrInLandingPad(instr, loop);
        return true;
    }
    else
    {
        return false;
    }
}